

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O0

void duckdb::QuantileOperation::
     ConstantOperation<float,duckdb::QuantileState<float,duckdb::QuantileStandardType>,duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>>
               (QuantileState<float,_duckdb::QuantileStandardType> *state,float *input,
               AggregateUnaryInput *unary_input,idx_t count)

{
  QuantileState<float,_duckdb::QuantileStandardType> *in_RCX;
  idx_t i;
  QuantileState<float,_duckdb::QuantileStandardType> *input_00;
  
  for (input_00 = (QuantileState<float,_duckdb::QuantileStandardType> *)0x0; input_00 < in_RCX;
      input_00 = (QuantileState<float,_duckdb::QuantileStandardType> *)
                 ((long)&(input_00->v).super_vector<float,_std::allocator<float>_>.
                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + 1)) {
    Operation<float,duckdb::QuantileState<float,duckdb::QuantileStandardType>,duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>>
              (in_RCX,(float *)input_00,(AggregateUnaryInput *)0x1d21e6f);
  }
  return;
}

Assistant:

static void ConstantOperation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input,
	                              idx_t count) {
		for (idx_t i = 0; i < count; i++) {
			Operation<INPUT_TYPE, STATE, OP>(state, input, unary_input);
		}
	}